

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICache.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_817b73::Cache::DumpEntryProperty
          (Value *__return_storage_ptr__,Cache *this,string *name,string *prop)

{
  Value *pVVar1;
  char *value;
  Value local_90;
  Value local_58;
  undefined1 local_29;
  string *local_28;
  string *prop_local;
  string *name_local;
  Cache *this_local;
  Value *property;
  
  local_29 = 0;
  local_28 = prop;
  prop_local = name;
  name_local = (string *)this;
  this_local = (Cache *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_58,local_28);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar1,&local_58);
  Json::Value::~Value(&local_58);
  value = cmState::GetCacheEntryProperty(this->State,prop_local,local_28);
  Json::Value::Value(&local_90,value);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"value");
  Json::Value::operator=(pVVar1,&local_90);
  Json::Value::~Value(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Cache::DumpEntryProperty(std::string const& name,
                                     std::string const& prop)
{
  Json::Value property = Json::objectValue;
  property["name"] = prop;
  property["value"] = this->State->GetCacheEntryProperty(name, prop);
  return property;
}